

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

void nhdp_db_neighbor_set_originator(nhdp_neighbor *neigh,netaddr *originator)

{
  list_entity *plVar1;
  uint8_t uVar2;
  int iVar3;
  avl_tree *tree;
  avl_node *local_f0;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_link *lnk;
  nhdp_neighbor *neigh2;
  netaddr *originator_local;
  nhdp_neighbor *neigh_local;
  
  iVar3 = memcmp(neigh,originator,0x12);
  if (iVar3 != 0) {
    if ((neigh->originator)._type != '\0') {
      avl_remove(&_neigh_originator_tree,&neigh->_originator_node);
      for (plVar1 = (neigh->_links).next; plVar1->prev != (neigh->_links).prev;
          plVar1 = plVar1->next) {
        avl_remove((avl_tree *)(plVar1[-0xc].next + 0x1f),(avl_node *)(plVar1 + 1));
      }
    }
    tree = nhdp_db_get_neigh_originator_tree();
    local_f0 = avl_find(tree,originator);
    if (local_f0 == (avl_node *)0x0) {
      local_f0 = (avl_node *)0x0;
    }
    else {
      local_f0 = local_f0 + -3;
    }
    if (local_f0 != (avl_node *)0x0) {
      avl_remove(&_neigh_originator_tree,local_f0 + 3);
      for (plVar1 = local_f0[1].list.next; plVar1->prev != local_f0[1].list.prev;
          plVar1 = plVar1->next) {
        avl_remove((avl_tree *)(plVar1[-0xc].next + 0x1f),(avl_node *)(plVar1 + 1));
      }
      memset(local_f0,0,0x12);
    }
    *(undefined8 *)(neigh->originator)._addr = *(undefined8 *)originator->_addr;
    *(undefined8 *)((neigh->originator)._addr + 8) = *(undefined8 *)(originator->_addr + 8);
    uVar2 = originator->_prefix_len;
    (neigh->originator)._type = originator->_type;
    (neigh->originator)._prefix_len = uVar2;
    if (originator->_type != '\0') {
      avl_insert(&_neigh_originator_tree,&neigh->_originator_node);
      for (plVar1 = (neigh->_links).next; plVar1->prev != (neigh->_links).prev;
          plVar1 = plVar1->next) {
        avl_insert((avl_tree *)(plVar1[-0xc].next + 0x1f),(avl_node *)(plVar1 + 1));
      }
    }
    oonf_class_event(&_neigh_info,neigh,OONF_OBJECT_CHANGED);
    *(undefined8 *)(neigh->_old_originator)._addr = *(undefined8 *)originator->_addr;
    *(undefined8 *)((neigh->_old_originator)._addr + 8) = *(undefined8 *)(originator->_addr + 8);
    uVar2 = originator->_prefix_len;
    (neigh->_old_originator)._type = originator->_type;
    (neigh->_old_originator)._prefix_len = uVar2;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_set_originator(struct nhdp_neighbor *neigh, const struct netaddr *originator) {
  struct nhdp_neighbor *neigh2;
  struct nhdp_link *lnk;

  if (memcmp(&neigh->originator, originator, sizeof(*originator)) == 0) {
    /* same originator, nothing to do */
    return;
  }

  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    /* different originator, remove from tree */
    avl_remove(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  neigh2 = nhdp_db_neighbor_get_by_originator(originator);
  if (neigh2) {
    /* different neighbor has this originator, invalidate it */
    avl_remove(&_neigh_originator_tree, &neigh2->_originator_node);

    list_for_each_element(&neigh2->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    netaddr_invalidate(&neigh2->originator);
  }

  /* copy originator address into neighbor */
  memcpy(&neigh->originator, originator, sizeof(*originator));

  if (netaddr_get_address_family(originator) != AF_UNSPEC) {
    /* add to tree if new originator is valid */
    avl_insert(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  /* inform everyone */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_CHANGED);

  /* overwrite "old originator" */
  memcpy(&neigh->_old_originator, originator, sizeof(*originator));
}